

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O3

void __thiscall
CMU462::DynamicScene::Mesh::Mesh(Mesh *this,PolymeshInfo *polyMesh,Matrix4x4 *transform)

{
  HalfedgeMesh *this_00;
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *plVar1;
  list<CMU462::Edge,_std::allocator<CMU462::Edge>_> *plVar2;
  list<CMU462::Face,_std::allocator<CMU462::Face>_> *plVar3;
  _Rb_tree_header *p_Var4;
  double *pdVar5;
  undefined8 *puVar6;
  pointer pPVar7;
  BSDF *pBVar8;
  mapped_type *pmVar9;
  Skeleton *this_01;
  ulong uVar10;
  ulong uVar11;
  Polygon *p;
  pointer __x;
  long lVar12;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> vertices;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  polygons;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> local_d0;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_b8;
  PolymeshInfo *local_98;
  Matrix4x4 *local_90;
  Vector4D local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  Vector4D local_50;
  
  p_Var4 = &(this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header;
  (this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header._M_header +
   8) = (_Base_ptr)0x0;
  (this->super_SceneObject).scene = (Scene *)0x0;
  (this->super_SceneObject).position.x = 0.0;
  (this->super_SceneObject).position.y = 0.0;
  (this->super_SceneObject).position.z = 0.0;
  (this->super_SceneObject).rotation.x = 0.0;
  (this->super_SceneObject).rotation.y = 0.0;
  (this->super_SceneObject).rotation.z = 0.0;
  (this->super_SceneObject).scale.x = 0.0;
  (this->super_SceneObject).scale.y = 0.0;
  (this->super_SceneObject).scale.z = 0.0;
  *(_Rb_tree_header **)
   ((long)&(this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header._M_header +
   0x10) = p_Var4;
  *(_Rb_tree_header **)
   ((long)&(this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header._M_header +
   0x18) = p_Var4;
  (this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var4 = &(this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header;
  (this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header._M_header +
   8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header._M_header +
   0x10) = p_Var4;
  *(_Rb_tree_header **)
   ((long)&(this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header._M_header +
   0x18) = p_Var4;
  (this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var4 = &(this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header;
  (this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header._M_header + 8)
       = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header._M_header +
   0x10) = p_Var4;
  *(_Rb_tree_header **)
   ((long)&(this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header._M_header +
   0x18) = p_Var4;
  (this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_SceneObject).isVisible = true;
  (this->super_SceneObject).isGhosted = false;
  (this->super_SceneObject).isPickable = true;
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR_set_draw_styles_00276640;
  this_00 = &this->mesh;
  (this->mesh).halfedges.super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->mesh).halfedges.super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->mesh).halfedges.super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>.
  _M_impl._M_node._M_size = 0;
  plVar1 = &(this->mesh).vertices;
  (this->mesh).vertices.super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->mesh).vertices.super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->mesh).vertices.super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
  _M_node._M_size = 0;
  plVar2 = &(this->mesh).edges;
  (this->mesh).edges.super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)plVar2;
  (this->mesh).edges.super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)plVar2;
  (this->mesh).edges.super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl._M_node.
  _M_size = 0;
  plVar3 = &(this->mesh).faces;
  (this->mesh).faces.super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)plVar3;
  (this->mesh).faces.super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)plVar3;
  (this->mesh).faces.super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
  _M_size = 0;
  plVar3 = &(this->mesh).boundaries;
  (this->mesh).boundaries.super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)plVar3;
  (this->mesh).boundaries.super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)plVar3;
  (this->mesh).boundaries.super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl.
  _M_node._M_size = 0;
  p_Var4 = &(this->idToElement)._M_t._M_impl.super__Rb_tree_header;
  (this->idToElement)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->idToElement)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->beveledFacePos).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->beveledFacePos).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->beveledEdgePos).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->beveledFacePos).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->beveledEdgePos).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->beveledEdgePos).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->beveledVertexPos).y = 0.0;
  (this->beveledVertexPos).z = 0.0;
  (this->bevelVertices).
  super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->beveledVertexPos).x = 0.0;
  (this->bevelVertices).
  super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bevelVertices).
  super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->idToElement)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
  (this->idToElement)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
  (this->idToElement)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __x = (polyMesh->polygons).
        super__Vector_base<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>.
        _M_impl.super__Vector_impl_data._M_start;
  pPVar7 = (polyMesh->polygons).
           super__Vector_base<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_90 = transform;
  if (__x != pPVar7) {
    do {
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::push_back(&local_b8,&__x->vertex_indices);
      __x = __x + 1;
    } while (__x != pPVar7);
  }
  local_98 = polyMesh;
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::vector
            (&local_d0,&polyMesh->vertices);
  if (local_d0.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_d0.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar12 = 0;
    uVar11 = 0;
    do {
      pdVar5 = (double *)
               ((long)&(local_d0.
                        super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                        _M_impl.super__Vector_impl_data._M_start)->x + lVar12);
      local_88.x = *pdVar5;
      local_88.y = pdVar5[1];
      local_88.z = *(double *)
                    ((long)&(local_d0.
                             super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>
                             ._M_impl.super__Vector_impl_data._M_start)->z + lVar12);
      local_88.w = 1.0;
      Matrix4x4::operator*(local_90,&local_88);
      Vector4D::projectTo3D(&local_50);
      *(undefined8 *)
       ((long)&(local_d0.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                _M_impl.super__Vector_impl_data._M_start)->z + lVar12) = local_58;
      puVar6 = (undefined8 *)
               ((long)&(local_d0.
                        super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                        _M_impl.super__Vector_impl_data._M_start)->x + lVar12);
      *puVar6 = local_68;
      puVar6[1] = uStack_60;
      uVar11 = uVar11 + 1;
      uVar10 = ((long)local_d0.
                      super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_d0.
                      super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      lVar12 = lVar12 + 0x18;
    } while (uVar11 <= uVar10 && uVar10 - uVar11 != 0);
  }
  HalfedgeMesh::build(this_00,&local_b8,&local_d0);
  if (local_98->material == (MaterialInfo *)0x0) {
    pBVar8 = (BSDF *)operator_new(0x28);
    pBVar8->_vptr_BSDF = (_func_int **)&PTR_f_00276f38;
    pBVar8[1]._vptr_BSDF = (_func_int **)0x3f8000003f800000;
    *(undefined ***)&pBVar8[1].rasterize_color = &PTR__Sampler3D_00277170;
    (pBVar8->rasterize_color).r = 1.0;
    (pBVar8->rasterize_color).g = 1.0;
    *(undefined8 *)&(pBVar8->rasterize_color).b = 0x3f8000003f800000;
  }
  else {
    pBVar8 = local_98->material->bsdf;
  }
  this->bsdf = pBVar8;
  (this->super_SceneObject).scale.x = 1.0;
  (this->super_SceneObject).scale.y = 1.0;
  (this->super_SceneObject).scale.z = 1.0;
  local_50.x = 0.0;
  pmVar9 = std::
           map<double,_CMU462::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
           ::operator[](&(this->super_SceneObject).scales.knots,&local_50.x);
  pmVar9->x = 1.0;
  pmVar9->y = 1.0;
  pmVar9->z = 1.0;
  this_01 = (Skeleton *)operator_new(0x1e0);
  Skeleton::Skeleton(this_01,this);
  this->skeleton = this_01;
  this->alreadyCheckingPositions = false;
  if (local_d0.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_b8);
  return;
}

Assistant:

Mesh::Mesh(Collada::PolymeshInfo &polyMesh, const Matrix4x4 &transform) {
  // Build halfedge mesh from polygon soup
  vector<vector<size_t>> polygons;
  for (const Collada::Polygon &p : polyMesh.polygons) {
    polygons.push_back(p.vertex_indices);
  }
  vector<Vector3D> vertices = polyMesh.vertices;  // DELIBERATE COPY.
  for (int i = 0; i < vertices.size(); i++) {
    vertices[i] = (transform * Vector4D(vertices[i], 1)).projectTo3D();
  }

  mesh.build(polygons, vertices);
  if (polyMesh.material) {
    bsdf = polyMesh.material->bsdf;
  } else {
    //      bsdf = new DiffuseBSDF(Spectrum(0.5f,0.5f,0.5f));
    bsdf = new DiffuseBSDF(Spectrum(1., 1., 1.));
  }

  scale = Vector3D(1., 1., 1.);
  scales.setValue(0, scale);

  skeleton = new Skeleton(this);

  alreadyCheckingPositions = false;
}